

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ModuleEnumerator.cpp
# Opt level: O0

StringRef * __thiscall axl::spy::ModuleIterator::prepareModuleFileName(ModuleIterator *this)

{
  bool bVar1;
  StringRef *in_RDI;
  StringRef *in_stack_ffffffffffffff88;
  StringRef *src;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffa0;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  StringRef *local_8;
  
  local_8 = in_RDI;
  if (in_RDI[1].m_p != (C *)0x0) {
    this_00 = &local_30;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffffa0,(C *)in_RDI);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
              (this_00,in_stack_ffffffffffffff88);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x153830);
    bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RDI);
    local_8 = in_RDI;
    if (bVar1) {
      src = (StringRef *)&stack0xffffffffffffffa0;
      io::getExeFilePath();
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator=(this_00,src);
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x153868);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

const sl::StringRef&
ModuleIterator::prepareModuleFileName() const {
	if (!m_linkMap)
		return m_moduleFileName;

	m_moduleFileName = m_linkMap->l_name;

	if (m_moduleFileName.isEmpty())
		m_moduleFileName = io::getExeFilePath();

	return m_moduleFileName;
}